

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PcacheRelease(PgHdr *p)

{
  long lVar1;
  PgHdr *in_RDI;
  
  in_RDI->pCache->nRefSum = in_RDI->pCache->nRefSum + -1;
  lVar1 = in_RDI->nRef + -1;
  in_RDI->nRef = lVar1;
  if (lVar1 == 0) {
    if ((in_RDI->flags & 1) == 0) {
      pcacheManageDirtyList(in_RDI,'\x03');
    }
    else {
      pcacheUnpin((PgHdr *)0x1586a8);
    }
  }
  return;
}

Assistant:

SQLITE_NOINLINE sqlite3PcacheRelease(PgHdr *p){
  assert( p->nRef>0 );
  p->pCache->nRefSum--;
  if( (--p->nRef)==0 ){
    if( p->flags&PGHDR_CLEAN ){
      pcacheUnpin(p);
    }else{
      pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
      assert( sqlite3PcachePageSanity(p) );
    }
  }
}